

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O0

void __thiscall
duckdb::MultiFileColumnDefinition::MultiFileColumnDefinition
          (MultiFileColumnDefinition *this,string *name,LogicalType *type)

{
  string *in_RSI;
  LogicalType *in_RDI;
  LogicalType *in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  LogicalType *type_00;
  Value *this_00;
  LogicalType *this_01;
  
  this_01 = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  LogicalType::LogicalType(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  vector<duckdb::MultiFileColumnDefinition,_true>::vector
            ((vector<duckdb::MultiFileColumnDefinition,_true> *)0x14cb1cc);
  type_00 = (LogicalType *)&in_RDI[3].type_info_;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)0x14cb1df);
  this_00 = (Value *)&in_RDI[3].type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
  LogicalType::LogicalType(this_01,(LogicalTypeId)((ulong)in_RDI >> 0x38));
  Value::Value(this_00,type_00);
  LogicalType::~LogicalType((LogicalType *)0x14cb219);
  return;
}

Assistant:

MultiFileColumnDefinition(const string &name, const LogicalType &type) : name(name), type(type) {
	}